

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void sensors_analytics::Sdk::ProfileIncrement(PropertiesNode *properties)

{
  Sdk *this;
  Sdk *pSVar1;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  this = instance_;
  if (instance_ != (Sdk *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"profile_increment",&local_79);
    std::__cxx11::string::string((string *)&local_58,"",&local_7a);
    pSVar1 = instance_;
    std::__cxx11::string::string((string *)&local_78,"",&local_7b);
    AddEvent(this,&local_38,&local_58,&properties->super_ObjectNode,&pSVar1->distinct_id_,&local_78)
    ;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void Sdk::ProfileIncrement(const PropertiesNode &properties) {
  if (instance_) {
    instance_->AddEvent("profile_increment",
                        "",
                        properties,
                        instance_->distinct_id_,
                        "");
  }
}